

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int bitset_container_andnot_justcard(bitset_container_t *src_1,bitset_container_t *src_2)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  int iVar4;
  uint32_t c;
  long lVar5;
  int iVar7;
  undefined1 auVar6 [16];
  ushort uVar8;
  undefined1 auVar13 [12];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  char cVar24;
  undefined1 auVar25 [12];
  byte bVar34;
  char cVar35;
  byte bVar36;
  char cVar37;
  byte bVar38;
  char cVar39;
  byte bVar40;
  char cVar41;
  byte bVar42;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined4 uVar9;
  undefined6 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar26 [12];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  
  if (croaring_detect_supported_architectures_buffer == 0x8000) {
    lVar5 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar3 = *(uint *)(lVar5 + 4);
    lVar5 = cpuid_Version_info(1);
    croaring_detect_supported_architectures_buffer =
         (*(uint *)(lVar5 + 0xc) >> 0x11 & 8 |
         uVar3 >> 2 & 0x40 | (uVar3 >> 3 & 4) + (uVar3 & 8) * 4) + (*(uint *)(lVar5 + 0xc) & 2) * 8;
    LOCK();
    UNLOCK();
  }
  if ((croaring_detect_supported_architectures_buffer & 4) == 0) {
    lVar5 = 0;
    iVar4 = 0;
    iVar7 = 0;
    do {
      puVar1 = (undefined8 *)((long)src_1->words + lVar5);
      puVar2 = (undefined8 *)((long)src_1->words + lVar5 + 0x10);
      auVar30._8_8_ = *puVar2;
      auVar30._0_8_ = *puVar1;
      auVar16._8_8_ = puVar2[1];
      auVar16._0_8_ = puVar1[1];
      puVar1 = (undefined8 *)((long)src_2->words + lVar5);
      puVar2 = (undefined8 *)((long)src_2->words + lVar5 + 0x10);
      auVar29._8_8_ = *puVar2;
      auVar29._0_8_ = *puVar1;
      auVar30 = ~auVar29 & auVar30;
      auVar23._8_8_ = puVar2[1];
      auVar23._0_8_ = puVar1[1];
      auVar16 = ~auVar23 & auVar16;
      auVar20._0_2_ = auVar30._0_2_ >> 1;
      auVar20._2_2_ = auVar30._2_2_ >> 1;
      auVar20._4_2_ = auVar30._4_2_ >> 1;
      auVar20._6_2_ = auVar30._6_2_ >> 1;
      auVar20._8_2_ = auVar30._8_2_ >> 1;
      auVar20._10_2_ = auVar30._10_2_ >> 1;
      auVar20._12_2_ = auVar30._12_2_ >> 1;
      auVar20._14_2_ = auVar30._14_2_ >> 1;
      auVar20 = auVar20 & _DAT_00125130;
      uVar8 = CONCAT11(auVar30[1] - auVar20[1],auVar30[0] - auVar20[0]);
      uVar9 = CONCAT13(auVar30[3] - auVar20[3],CONCAT12(auVar30[2] - auVar20[2],uVar8));
      uVar10 = CONCAT15(auVar30[5] - auVar20[5],CONCAT14(auVar30[4] - auVar20[4],uVar9));
      uVar11 = CONCAT17(auVar30[7] - auVar20[7],CONCAT16(auVar30[6] - auVar20[6],uVar10));
      auVar25._0_10_ = CONCAT19(auVar30[9] - auVar20[9],CONCAT18(auVar30[8] - auVar20[8],uVar11));
      auVar25[10] = auVar30[10] - auVar20[10];
      auVar25[0xb] = auVar30[0xb] - auVar20[0xb];
      auVar27[0xc] = auVar30[0xc] - auVar20[0xc];
      auVar27._0_12_ = auVar25;
      auVar27[0xd] = auVar30[0xd] - auVar20[0xd];
      auVar31[0xe] = auVar30[0xe] - auVar20[0xe];
      auVar31._0_14_ = auVar27;
      auVar31[0xf] = auVar30[0xf] - auVar20[0xf];
      auVar21 = auVar31 & _DAT_00125140;
      auVar32._0_2_ = uVar8 >> 2;
      auVar32._2_2_ = (ushort)((uint)uVar9 >> 0x12);
      auVar32._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
      auVar32._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
      auVar32._8_2_ = (ushort)((unkuint10)auVar25._0_10_ >> 0x42);
      auVar32._10_2_ = auVar25._10_2_ >> 2;
      auVar32._12_2_ = auVar27._12_2_ >> 2;
      auVar32._14_2_ = auVar31._14_2_ >> 2;
      auVar32 = auVar32 & _DAT_00125140;
      cVar24 = auVar32[0] + auVar21[0];
      bVar34 = auVar32[1] + auVar21[1];
      uVar8 = CONCAT11(bVar34,cVar24);
      cVar35 = auVar32[2] + auVar21[2];
      bVar36 = auVar32[3] + auVar21[3];
      uVar9 = CONCAT13(bVar36,CONCAT12(cVar35,uVar8));
      cVar37 = auVar32[4] + auVar21[4];
      bVar38 = auVar32[5] + auVar21[5];
      uVar10 = CONCAT15(bVar38,CONCAT14(cVar37,uVar9));
      cVar39 = auVar32[6] + auVar21[6];
      bVar40 = auVar32[7] + auVar21[7];
      uVar11 = CONCAT17(bVar40,CONCAT16(cVar39,uVar10));
      cVar41 = auVar32[8] + auVar21[8];
      bVar42 = auVar32[9] + auVar21[9];
      auVar26._0_10_ = CONCAT19(bVar42,CONCAT18(cVar41,uVar11));
      auVar26[10] = auVar32[10] + auVar21[10];
      auVar26[0xb] = auVar32[0xb] + auVar21[0xb];
      auVar28[0xc] = auVar32[0xc] + auVar21[0xc];
      auVar28._0_12_ = auVar26;
      auVar28[0xd] = auVar32[0xd] + auVar21[0xd];
      auVar33[0xe] = auVar32[0xe] + auVar21[0xe];
      auVar33._0_14_ = auVar28;
      auVar33[0xf] = auVar32[0xf] + auVar21[0xf];
      auVar22[0] = (char)(uVar8 >> 4) + cVar24;
      auVar22[1] = (bVar34 >> 4) + bVar34;
      auVar22[2] = (char)(ushort)((uint)uVar9 >> 0x14) + cVar35;
      auVar22[3] = (bVar36 >> 4) + bVar36;
      auVar22[4] = (char)(ushort)((uint6)uVar10 >> 0x24) + cVar37;
      auVar22[5] = (bVar38 >> 4) + bVar38;
      auVar22[6] = (char)(ushort)((ulong)uVar11 >> 0x34) + cVar39;
      auVar22[7] = (bVar40 >> 4) + bVar40;
      auVar22[8] = (char)(ushort)((unkuint10)auVar26._0_10_ >> 0x44) + cVar41;
      auVar22[9] = (bVar42 >> 4) + bVar42;
      auVar22[10] = (char)(auVar26._10_2_ >> 4) + auVar26[10];
      auVar22[0xb] = (auVar26[0xb] >> 4) + auVar26[0xb];
      auVar22[0xc] = (char)(auVar28._12_2_ >> 4) + auVar28[0xc];
      auVar22[0xd] = (auVar28[0xd] >> 4) + auVar28[0xd];
      auVar22[0xe] = (char)(auVar33._14_2_ >> 4) + auVar33[0xe];
      auVar22[0xf] = (auVar33[0xf] >> 4) + auVar33[0xf];
      auVar23 = psadbw(auVar22 & _DAT_00125150,(undefined1  [16])0x0);
      auVar21._0_2_ = auVar16._0_2_ >> 1;
      auVar21._2_2_ = auVar16._2_2_ >> 1;
      auVar21._4_2_ = auVar16._4_2_ >> 1;
      auVar21._6_2_ = auVar16._6_2_ >> 1;
      auVar21._8_2_ = auVar16._8_2_ >> 1;
      auVar21._10_2_ = auVar16._10_2_ >> 1;
      auVar21._12_2_ = auVar16._12_2_ >> 1;
      auVar21._14_2_ = auVar16._14_2_ >> 1;
      auVar21 = auVar21 & _DAT_00125130;
      uVar8 = CONCAT11(auVar16[1] - auVar21[1],auVar16[0] - auVar21[0]);
      uVar9 = CONCAT13(auVar16[3] - auVar21[3],CONCAT12(auVar16[2] - auVar21[2],uVar8));
      uVar10 = CONCAT15(auVar16[5] - auVar21[5],CONCAT14(auVar16[4] - auVar21[4],uVar9));
      uVar11 = CONCAT17(auVar16[7] - auVar21[7],CONCAT16(auVar16[6] - auVar21[6],uVar10));
      auVar12._0_10_ = CONCAT19(auVar16[9] - auVar21[9],CONCAT18(auVar16[8] - auVar21[8],uVar11));
      auVar12[10] = auVar16[10] - auVar21[10];
      auVar12[0xb] = auVar16[0xb] - auVar21[0xb];
      auVar14[0xc] = auVar16[0xc] - auVar21[0xc];
      auVar14._0_12_ = auVar12;
      auVar14[0xd] = auVar16[0xd] - auVar21[0xd];
      auVar17[0xe] = auVar16[0xe] - auVar21[0xe];
      auVar17._0_14_ = auVar14;
      auVar17[0xf] = auVar16[0xf] - auVar21[0xf];
      auVar21 = auVar17 & _DAT_00125140;
      auVar18._0_2_ = uVar8 >> 2;
      auVar18._2_2_ = (ushort)((uint)uVar9 >> 0x12);
      auVar18._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
      auVar18._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
      auVar18._8_2_ = (ushort)((unkuint10)auVar12._0_10_ >> 0x42);
      auVar18._10_2_ = auVar12._10_2_ >> 2;
      auVar18._12_2_ = auVar14._12_2_ >> 2;
      auVar18._14_2_ = auVar17._14_2_ >> 2;
      auVar18 = auVar18 & _DAT_00125140;
      cVar24 = auVar18[0] + auVar21[0];
      bVar34 = auVar18[1] + auVar21[1];
      uVar8 = CONCAT11(bVar34,cVar24);
      cVar35 = auVar18[2] + auVar21[2];
      bVar36 = auVar18[3] + auVar21[3];
      uVar9 = CONCAT13(bVar36,CONCAT12(cVar35,uVar8));
      cVar37 = auVar18[4] + auVar21[4];
      bVar38 = auVar18[5] + auVar21[5];
      uVar10 = CONCAT15(bVar38,CONCAT14(cVar37,uVar9));
      cVar39 = auVar18[6] + auVar21[6];
      bVar40 = auVar18[7] + auVar21[7];
      uVar11 = CONCAT17(bVar40,CONCAT16(cVar39,uVar10));
      cVar41 = auVar18[8] + auVar21[8];
      bVar42 = auVar18[9] + auVar21[9];
      auVar13._0_10_ = CONCAT19(bVar42,CONCAT18(cVar41,uVar11));
      auVar13[10] = auVar18[10] + auVar21[10];
      auVar13[0xb] = auVar18[0xb] + auVar21[0xb];
      auVar15[0xc] = auVar18[0xc] + auVar21[0xc];
      auVar15._0_12_ = auVar13;
      auVar15[0xd] = auVar18[0xd] + auVar21[0xd];
      auVar19[0xe] = auVar18[0xe] + auVar21[0xe];
      auVar19._0_14_ = auVar15;
      auVar19[0xf] = auVar18[0xf] + auVar21[0xf];
      auVar6[0] = (char)(uVar8 >> 4) + cVar24;
      auVar6[1] = (bVar34 >> 4) + bVar34;
      auVar6[2] = (char)(ushort)((uint)uVar9 >> 0x14) + cVar35;
      auVar6[3] = (bVar36 >> 4) + bVar36;
      auVar6[4] = (char)(ushort)((uint6)uVar10 >> 0x24) + cVar37;
      auVar6[5] = (bVar38 >> 4) + bVar38;
      auVar6[6] = (char)(ushort)((ulong)uVar11 >> 0x34) + cVar39;
      auVar6[7] = (bVar40 >> 4) + bVar40;
      auVar6[8] = (char)(ushort)((unkuint10)auVar13._0_10_ >> 0x44) + cVar41;
      auVar6[9] = (bVar42 >> 4) + bVar42;
      auVar6[10] = (char)(auVar13._10_2_ >> 4) + auVar13[10];
      auVar6[0xb] = (auVar13[0xb] >> 4) + auVar13[0xb];
      auVar6[0xc] = (char)(auVar15._12_2_ >> 4) + auVar15[0xc];
      auVar6[0xd] = (auVar15[0xd] >> 4) + auVar15[0xd];
      auVar6[0xe] = (char)(auVar19._14_2_ >> 4) + auVar19[0xe];
      auVar6[0xf] = (auVar19[0xf] >> 4) + auVar19[0xf];
      auVar21 = psadbw(auVar6 & _DAT_00125150,(undefined1  [16])0x0);
      iVar4 = auVar21._0_4_ + auVar23._0_4_ + iVar4;
      iVar7 = auVar21._8_4_ + auVar23._8_4_ + iVar7;
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0x2000);
    return iVar7 + iVar4;
  }
  iVar4 = _avx2_bitset_container_andnot_justcard(src_1,src_2);
  return iVar4;
}

Assistant:

static inline uint32_t croaring_detect_supported_architectures() {
    static _Atomic int buffer = CROARING_UNINITIALIZED;
    if(buffer == CROARING_UNINITIALIZED) {
      buffer = dynamic_croaring_detect_supported_architectures();
    }
    return buffer;
}